

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.hpp
# Opt level: O2

bool helics::fileops::isMember(value *element,string *key)

{
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *v;
  value uval;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  basic_value<toml::type_config> bStack_1a8;
  basic_value<toml::type_config> local_e0;
  
  toml::basic_value<toml::type_config>::basic_value(&bStack_1a8);
  v = toml::find_or<toml::type_config,std::__cxx11::string>(element,key,&bStack_1a8);
  toml::basic_value<toml::type_config>::basic_value(&local_e0,v);
  toml::basic_value<toml::type_config>::~basic_value(&local_e0);
  toml::basic_value<toml::type_config>::~basic_value(&bStack_1a8);
  return local_e0.type_ != empty;
}

Assistant:

inline bool isMember(const toml::value& element, const std::string& key)
{
    toml::value uval;
    auto val = toml::find_or(element, key, uval);

    return (!val.is_empty());
}